

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_column_data.cpp
# Opt level: O3

void __thiscall
duckdb::ListColumnData::Append
          (ListColumnData *this,BaseStatistics *stats,ColumnAppendState *state,Vector *vector,
          idx_t count)

{
  idx_t iVar1;
  sel_t *psVar2;
  byte bVar3;
  bool bVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  data_ptr_t pdVar5;
  BaseStatistics *stats_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  int iVar7;
  pointer pCVar8;
  undefined4 extraout_var;
  type puVar9;
  TemplatedValidityData<unsigned_long> *pTVar10;
  Vector *other;
  BaseStatistics *pBVar11;
  reference pvVar12;
  size_t __i;
  pointer *__ptr;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  idx_t count_00;
  size_t sVar16;
  long lVar17;
  UnifiedVectorFormat vdata;
  UnifiedVectorFormat list_data;
  Vector child_vector;
  _Head_base<0UL,_unsigned_long_*,_false> local_198;
  ColumnAppendState *local_190;
  _Head_base<0UL,_unsigned_long_*,_false> local_188;
  shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> sStack_180;
  SelectionVector *local_170;
  size_t local_168;
  ListColumnData *local_160;
  long local_158;
  data_ptr_t local_150;
  unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true> *local_148;
  BaseStatistics *local_140;
  Vector *local_138;
  size_t local_130;
  UnifiedVectorFormat local_128;
  UnifiedVectorFormat local_e0;
  undefined1 local_98 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *ap_Stack_90 [6];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  local_190 = state;
  UnifiedVectorFormat::UnifiedVectorFormat(&local_e0);
  Vector::ToUnifiedFormat(vector,count,&local_e0);
  local_148 = &this->child_column;
  pCVar8 = unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>::operator->
                     (local_148);
  iVar7 = (*pCVar8->_vptr_ColumnData[3])();
  local_158 = CONCAT44(extraout_var,iVar7);
  local_188._M_head_impl = (unsigned_long *)0x0;
  sStack_180.internal.
  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  sStack_180.internal.
  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_170 = (SelectionVector *)count;
  local_198._M_head_impl = (unsigned_long *)operator_new__(-(ulong)(count >> 0x3d != 0) | count * 8)
  ;
  local_150 = local_e0.data;
  bVar4 = true;
  count_00 = 0;
  local_140 = stats;
  local_138 = vector;
  if (count != 0) {
    __i = 0;
    local_168 = count;
    local_160 = this;
    do {
      pdVar5 = local_150;
      this = local_160;
      count = local_168;
      sVar16 = __i;
      if ((local_e0.sel)->sel_vector != (sel_t *)0x0) {
        sVar16 = (size_t)(local_e0.sel)->sel_vector[__i];
      }
      local_130 = __i;
      if ((local_e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
           (unsigned_long *)0x0) ||
         ((local_e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[sVar16 >> 6]
           >> (sVar16 & 0x3f) & 1) != 0)) {
        lVar17 = sVar16 * 0x10;
        iVar1 = *(idx_t *)(local_150 + lVar17);
        lVar14 = *(long *)(local_150 + lVar17 + 8);
        puVar9 = unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>,_true>::operator[]
                           ((unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>,_true>
                             *)&local_198,__i);
        bVar4 = (bool)(bVar4 & iVar1 == count_00);
        *puVar9 = lVar14 + local_158 + count_00;
        count_00 = count_00 + *(long *)(pdVar5 + lVar17 + 8);
        count = local_168;
        this = local_160;
      }
      else {
        if (local_188._M_head_impl == (unsigned_long *)0x0) {
          local_128.sel = local_170;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_98,(unsigned_long *)&local_128);
          p_Var6 = ap_Stack_90[0];
          sStack_180.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)local_98;
          this_00._M_pi =
               sStack_180.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi;
          local_98 = (undefined1  [8])0x0;
          ap_Stack_90[0] = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          sStack_180.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = p_Var6;
          if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
            if (ap_Stack_90[0] != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(ap_Stack_90[0]);
            }
          }
          pTVar10 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              (&sStack_180);
          local_188._M_head_impl =
               (pTVar10->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
        }
        bVar3 = (byte)__i & 0x3f;
        local_188._M_head_impl[__i >> 6] =
             local_188._M_head_impl[__i >> 6] & (-2L << bVar3 | 0xfffffffffffffffeU >> 0x40 - bVar3)
        ;
        puVar9 = unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>,_true>::operator[]
                           ((unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>,_true>
                             *)&local_198,__i);
        *puVar9 = local_158 + count_00;
      }
      __i = local_130 + 1;
    } while (count != __i);
  }
  other = ListVector::GetEntry(local_138);
  Vector::Vector((Vector *)local_98,other);
  stats_00 = local_140;
  if (!bVar4) {
    SelectionVector::SelectionVector((SelectionVector *)&local_128,count_00);
    if (count != 0) {
      psVar2 = (local_e0.sel)->sel_vector;
      uVar13 = 0;
      lVar14 = 0;
      do {
        uVar15 = uVar13;
        if (psVar2 != (sel_t *)0x0) {
          uVar15 = (ulong)psVar2[uVar13];
        }
        if ((local_e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
             (unsigned_long *)0x0) ||
           ((local_e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar15 >> 6]
             >> (uVar15 & 0x3f) & 1) != 0)) {
          lVar17 = *(long *)(local_150 + uVar15 * 0x10 + 8);
          if (lVar17 != 0) {
            iVar7 = *(int *)(local_150 + uVar15 * 0x10);
            do {
              *(int *)((long)&(local_128.sel)->sel_vector + lVar14 * 4) = iVar7;
              lVar14 = lVar14 + 1;
              iVar7 = iVar7 + 1;
              lVar17 = lVar17 + -1;
            } while (lVar17 != 0);
          }
        }
        uVar13 = uVar13 + 1;
      } while (uVar13 != count);
    }
    Vector::Slice((Vector *)local_98,other,(SelectionVector *)&local_128,count_00);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_128.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_128.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask);
    }
  }
  UnifiedVectorFormat::UnifiedVectorFormat(&local_128);
  local_128.sel = FlatVector::IncrementalSelectionVector();
  local_128.data = (data_ptr_t)local_198._M_head_impl;
  if (count_00 != 0) {
    pCVar8 = unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>::
             operator->(local_148);
    pBVar11 = ListStats::GetChildStats(stats_00);
    pvVar12 = vector<duckdb::ColumnAppendState,_true>::operator[](&local_190->child_appends,1);
    (*pCVar8->_vptr_ColumnData[0x12])(pCVar8,pBVar11,pvVar12,local_98,count_00);
  }
  ColumnData::AppendData(&this->super_ColumnData,stats_00,local_190,&local_128,count);
  local_128.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
       local_188._M_head_impl;
  shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
            (&local_128.validity.super_TemplatedValidityMask<unsigned_long>.validity_data,
             &sStack_180);
  local_128.validity.super_TemplatedValidityMask<unsigned_long>.capacity = (idx_t)local_170;
  pvVar12 = vector<duckdb::ColumnAppendState,_true>::operator[](&local_190->child_appends,0);
  ValidityColumnData::AppendData(&this->validity,stats_00,pvVar12,&local_128,count);
  if (local_128.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_128.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_128.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_128.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
  }
  if (local_48._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48._M_pi);
  }
  if (local_60._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60._M_pi);
  }
  LogicalType::~LogicalType((LogicalType *)ap_Stack_90);
  if (local_198._M_head_impl != (unsigned_long *)0x0) {
    operator_delete__(local_198._M_head_impl);
  }
  if (sStack_180.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (sStack_180.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_e0.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_e0.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

void ListColumnData::Append(BaseStatistics &stats, ColumnAppendState &state, Vector &vector, idx_t count) {
	D_ASSERT(count > 0);
	UnifiedVectorFormat list_data;
	vector.ToUnifiedFormat(count, list_data);
	auto &list_validity = list_data.validity;

	// construct the list_entry_t entries to append to the column data
	auto input_offsets = UnifiedVectorFormat::GetData<list_entry_t>(list_data);
	auto start_offset = child_column->GetMaxEntry();
	idx_t child_count = 0;

	ValidityMask append_mask(count);
	auto append_offsets = unique_ptr<uint64_t[]>(new uint64_t[count]);
	bool child_contiguous = true;
	for (idx_t i = 0; i < count; i++) {
		auto input_idx = list_data.sel->get_index(i);
		if (list_validity.RowIsValid(input_idx)) {
			auto &input_list = input_offsets[input_idx];
			if (input_list.offset != child_count) {
				child_contiguous = false;
			}
			append_offsets[i] = start_offset + child_count + input_list.length;
			child_count += input_list.length;
		} else {
			append_mask.SetInvalid(i);
			append_offsets[i] = start_offset + child_count;
		}
	}
	auto &list_child = ListVector::GetEntry(vector);
	Vector child_vector(list_child);
	if (!child_contiguous) {
		// if the child of the list vector is a non-contiguous vector (i.e. list elements are repeating or have gaps)
		// we first push a selection vector and flatten the child vector to turn it into a contiguous vector
		SelectionVector child_sel(child_count);
		idx_t current_count = 0;
		for (idx_t i = 0; i < count; i++) {
			auto input_idx = list_data.sel->get_index(i);
			if (list_validity.RowIsValid(input_idx)) {
				auto &input_list = input_offsets[input_idx];
				for (idx_t list_idx = 0; list_idx < input_list.length; list_idx++) {
					child_sel.set_index(current_count++, input_list.offset + list_idx);
				}
			}
		}
		D_ASSERT(current_count == child_count);
		child_vector.Slice(list_child, child_sel, child_count);
	}

	UnifiedVectorFormat vdata;
	vdata.sel = FlatVector::IncrementalSelectionVector();
	vdata.data = data_ptr_cast(append_offsets.get());

	// append the child vector
	if (child_count > 0) {
		child_column->Append(ListStats::GetChildStats(stats), state.child_appends[1], child_vector, child_count);
	}
	// append the list offsets
	ColumnData::AppendData(stats, state, vdata, count);
	// append the validity data
	vdata.validity = append_mask;
	validity.AppendData(stats, state.child_appends[0], vdata, count);
}